

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadType(BinaryReader *this,Type *out_value,char *desc)

{
  uint in_EAX;
  Result RVar1;
  Enum EVar2;
  uint32_t heap_type;
  uint32_t type;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  RVar1 = ReadS32Leb128(this,(uint32_t *)((long)&local_28 + 4),desc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if ((ulong)local_28._4_4_ == 0xffffffeb) {
      local_28 = (ulong)local_28._4_4_ << 0x20;
      RVar1 = ReadS32Leb128(this,(uint32_t *)&local_28,desc);
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      *out_value = (Type)(local_28 << 0x20 | 0xffffffeb);
    }
    else {
      *out_value = (Type)((ulong)local_28._4_4_ | 0xffffffff00000000);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  if (static_cast<Type::Enum>(type) == Type::Reference) {
    uint32_t heap_type = 0;
    CHECK_RESULT(ReadS32Leb128(&heap_type, desc));
    *out_value = Type(Type::Reference, heap_type);
  } else {
    *out_value = static_cast<Type>(type);
  }
  return Result::Ok;
}